

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O1

drwav_bool32 drwav_init_file(drwav *pWav,char *filename)

{
  drwav_bool32 dVar1;
  FILE *pUserData;
  
  pUserData = fopen(filename,"rb");
  if (pUserData != (FILE *)0x0) {
    dVar1 = drwav_init(pWav,drwav__on_read_stdio,drwav__on_seek_stdio,pUserData);
    return dVar1;
  }
  return 0;
}

Assistant:

drwav_bool32 drwav_init_file(drwav* pWav, const char* filename) {
    FILE* pFile;
#if defined(_MSC_VER) && _MSC_VER >= 1400
    if (fopen_s(&pFile, filename, "rb") != 0) {
        return DRWAV_FALSE;
    }
#else
    pFile = fopen(filename, "rb");
    if (pFile == NULL) {
        return DRWAV_FALSE;
    }
#endif

    return drwav_init(pWav, drwav__on_read_stdio, drwav__on_seek_stdio, (void*)pFile);
}